

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O1

void __thiscall
trng::lagfib2plus<unsigned_int,_168U,_521U>::seed<trng::minstd>
          (lagfib2plus<unsigned_int,_168U,_521U> *this,minstd *g)

{
  result_type rVar1;
  uint i;
  long lVar2;
  result_type_conflict rVar3;
  int iVar4;
  result_type rVar5;
  ulong uVar6;
  
  lVar2 = 0;
  do {
    rVar5 = (g->S).r;
    iVar4 = 0x20;
    rVar3 = 0;
    do {
      uVar6 = ((ulong)rVar5 * 0x41a7 >> 0x1f) + ((ulong)rVar5 * 0x41a7 & 0x7fffffff);
      rVar1 = (result_type)uVar6;
      rVar5 = rVar1 + 0x80000001;
      if (uVar6 < 0x7fffffff) {
        rVar5 = rVar1;
      }
      rVar3 = (uint)(rVar5 + 0xbfffffff < 0xc0000000) + rVar3 * 2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    (g->S).r = rVar5;
    (this->S).r[lVar2] = rVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x209);
  (this->S).index = 0x208;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < B; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = B - 1;
    }